

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestSwallowFailuresLimit::Run(BuildTestSwallowFailuresLimit *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string err;
  int fail_count;
  BuildTestSwallowFailuresLimit *this_local;
  
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 0xc));
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule fail\n  command = fail\nbuild out1: fail\nbuild out2: fail\nbuild out3: fail\nbuild final: cat out1 out2 out3\n"
              ,stack0xffffffffffffffe4);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar4) {
    (this->super_BuildTest).config_.failures_allowed = 0xb;
    std::__cxx11::string::string((string *)local_40);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"final",&local_61);
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_60,(string *)local_40);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x4ba,"builder_.AddTarget(\"final\", &err)");
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x4bb,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar2) {
      bVar2 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_40);
      testing::Test::Check
                (pTVar1,(bool)(~bVar2 & 1),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x4bd,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar6 == 3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x4be,"3u == command_runner_.commands_ran_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        bVar2 = std::operator==("cannot make progress due to previous errors",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x4bf,"\"cannot make progress due to previous errors\" == err");
        if (!bVar2) {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, SwallowFailuresLimit) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule fail\n"
"  command = fail\n"
"build out1: fail\n"
"build out2: fail\n"
"build out3: fail\n"
"build final: cat out1 out2 out3\n"));

  // Swallow ten failures; we should stop before building final.
  config_.failures_allowed = 11;

  string err;
  EXPECT_TRUE(builder_.AddTarget("final", &err));
  ASSERT_EQ("", err);

  EXPECT_FALSE(builder_.Build(&err));
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
  ASSERT_EQ("cannot make progress due to previous errors", err);
}